

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O2

void Cnf_ManPostprocess(Cnf_Man_t *p)

{
  uint uVar1;
  Vec_Ptr_t *p_00;
  Cnf_Cut_t *pCut;
  Cnf_Cut_t *pCutFan;
  bool bVar2;
  bool bVar3;
  void *pvVar4;
  ulong uVar5;
  Aig_Obj_t *pAVar6;
  Cnf_Cut_t *pCutRes;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int i;
  long lVar11;
  int Order [16];
  int Costs [16];
  
  i = 0;
  do {
    p_00 = p->pManAig->vObjs;
    if (p_00->nSize <= i) {
      return;
    }
    pvVar4 = Vec_PtrEntry(p_00,i);
    if (((pvVar4 != (void *)0x0) && ((*(ulong *)((long)pvVar4 + 0x18) & 0xffffffc0) != 0)) &&
       (0xfffffffd < ((uint)*(ulong *)((long)pvVar4 + 0x18) & 7) - 7)) {
      pCut = *(Cnf_Cut_t **)((long)pvVar4 + 0x28);
      lVar11 = 0;
      while( true ) {
        uVar5 = (ulong)pCut->nFanins;
        if ((long)uVar5 <= lVar11) break;
        pAVar6 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + lVar11 * 4 + -8));
        if (pAVar6 == (Aig_Obj_t *)0x0) {
          uVar5 = (ulong)(byte)pCut->nFanins;
          break;
        }
        Order[lVar11] = (int)lVar11;
        iVar8 = 0;
        if (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7) {
          iVar8 = (int)*(char *)((long)(pAVar6->field_5).pData + 1);
        }
        Costs[lVar11] = iVar8;
        lVar11 = lVar11 + 1;
      }
      bVar7 = (byte)uVar5;
      if ((char)bVar7 < '\x02') {
        bVar7 = 1;
      }
      uVar10 = 0;
      bVar3 = false;
      do {
        while (bVar2 = bVar3, uVar9 = uVar10, bVar7 - 1 != uVar9) {
          iVar8 = Order[uVar9];
          uVar10 = uVar9 + 1;
          bVar3 = bVar2;
          if (Costs[Order[uVar9 + 1]] < Costs[iVar8]) {
            Order[uVar9] = Order[uVar9 + 1];
            Order[uVar10] = iVar8;
            bVar3 = true;
          }
        }
        uVar10 = 0;
        bVar3 = false;
      } while (bVar2);
      for (lVar11 = 0; lVar11 < (char)uVar5; lVar11 = lVar11 + 1) {
        pAVar6 = Aig_ManObj(p->pManAig,*(int *)((long)pCut[1].vIsop + (long)Order[lVar11] * 4 + -8))
        ;
        if (pAVar6 == (Aig_Obj_t *)0x0) break;
        uVar1 = *(uint *)&pAVar6->field_0x18;
        if (0xfffffffd < (uVar1 & 7) - 7) {
          if (uVar1 < 0x40) {
            __assert_fail("pFan->nRefs != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                          ,0xcc,"void Cnf_ManPostprocess(Cnf_Man_t *)");
          }
          if ((uVar1 & 0xffffffc0) == 0x40) {
            pCutFan = (Cnf_Cut_t *)(pAVar6->field_5).pData;
            pCutRes = Cnf_CutCompose(p,pCut,pCutFan,pAVar6->Id);
            if (pCutRes != (Cnf_Cut_t *)0x0) {
              if ((pCutRes->Cost != 0x7f) &&
                 ((int)pCutRes->Cost <= (int)pCutFan->Cost + (int)pCut->Cost)) {
                *(Cnf_Cut_t **)((long)pvVar4 + 0x28) = pCutRes;
                (pAVar6->field_5).pData = (void *)0x0;
                Cnf_CutUpdateRefs(p,pCut,pCutFan,pCutRes);
                if ((*(uint *)&pAVar6->field_0x18 & 0xffffffc0) != 0) {
                  __assert_fail("pFan->nRefs == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/cnf/cnfPost.c"
                                ,0xe0,"void Cnf_ManPostprocess(Cnf_Man_t *)");
                }
                Cnf_CutFree(pCut);
                Cnf_CutFree(pCutFan);
                break;
              }
              Cnf_CutFree(pCutRes);
            }
          }
        }
        uVar5 = (ulong)(byte)pCut->nFanins;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Cnf_ManPostprocess( Cnf_Man_t * p )
{
    Cnf_Cut_t * pCut, * pCutFan, * pCutRes;
    Aig_Obj_t * pObj, * pFan;
    int Order[16], Costs[16];
    int i, k, fChanges;
    Aig_ManForEachNode( p->pManAig, pObj, i )
    {
        if ( pObj->nRefs == 0 )
            continue;
        pCut = Cnf_ObjBestCut(pObj);

        // sort fanins according to their size
        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        {
            Order[k] = k;
            Costs[k] = Aig_ObjIsNode(pFan)? Cnf_ObjBestCut(pFan)->Cost : 0;
        }
        // sort the cuts by Weight
        do {
            int Temp;
            fChanges = 0;
            for ( k = 0; k < pCut->nFanins - 1; k++ )
            {
                if ( Costs[Order[k]] <= Costs[Order[k+1]] )
                    continue;
                Temp = Order[k];
                Order[k] = Order[k+1];
                Order[k+1] = Temp;
                fChanges = 1;
            }
        } while ( fChanges );


//        Cnf_CutForEachLeaf( p->pManAig, pCut, pFan, k )
        for ( k = 0; (k < (int)(pCut)->nFanins) && ((pFan) = Aig_ManObj(p->pManAig, (pCut)->pFanins[Order[k]])); k++ )
        {
            if ( !Aig_ObjIsNode(pFan) )
                continue;
            assert( pFan->nRefs != 0 );
            if ( pFan->nRefs != 1 )
                continue;
            pCutFan = Cnf_ObjBestCut(pFan);
            // try composing these two cuts
//            Cnf_CutPrint( pCut );
            pCutRes = Cnf_CutCompose( p, pCut, pCutFan, pFan->Id );
//            Cnf_CutPrint( pCut );
//            printf( "\n" );
            // check if the cost if reduced
            if ( pCutRes == NULL || pCutRes->Cost == 127 || pCutRes->Cost > pCut->Cost + pCutFan->Cost )
            {
                if ( pCutRes )
                    Cnf_CutFree( pCutRes );
                continue;
            }
            // update the cut
            Cnf_ObjSetBestCut( pObj, pCutRes );
            Cnf_ObjSetBestCut( pFan, NULL );
            Cnf_CutUpdateRefs( p, pCut, pCutFan, pCutRes );
            assert( pFan->nRefs == 0 );
            Cnf_CutFree( pCut );
            Cnf_CutFree( pCutFan );
            break;
        }
    }
}